

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

void FSE_initCState(FSE_CState_t *statePtr,FSE_CTable *ct)

{
  U16 UVar1;
  int local_3c;
  U32 tableLog;
  U16 *u16ptr;
  void *ptr;
  FSE_CTable *ct_local;
  FSE_CState_t *statePtr_local;
  
  UVar1 = MEM_read16(ct);
  statePtr->value = 1L << ((byte)UVar1 & 0x3f);
  statePtr->stateTable = ct + 1;
  if (UVar1 == 0) {
    local_3c = 1;
  }
  else {
    local_3c = 1 << ((byte)UVar1 - 1 & 0x1f);
  }
  statePtr->symbolTT = ct + (long)local_3c + 1;
  statePtr->stateLog = (uint)UVar1;
  return;
}

Assistant:

MEM_STATIC void FSE_initCState(FSE_CState_t* statePtr, const FSE_CTable* ct)
{
    const void* ptr = ct;
    const U16* u16ptr = (const U16*) ptr;
    const U32 tableLog = MEM_read16(ptr);
    statePtr->value = (ptrdiff_t)1<<tableLog;
    statePtr->stateTable = u16ptr+2;
    statePtr->symbolTT = ct + 1 + (tableLog ? (1<<(tableLog-1)) : 1);
    statePtr->stateLog = tableLog;
}